

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  IRContext *pIVar3;
  iterator __last;
  pointer pOVar4;
  uint32_t uVar5;
  int iVar6;
  _Type member_idx;
  array<signed_char,_4UL> aVar7;
  Instruction *pIVar8;
  Operand *__args;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  uint32_t index;
  bool bVar12;
  OperandList new_operands;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  if (inst->opcode_ == OpCompositeInsert) {
    iVar6 = 1;
    uVar10 = 2;
  }
  else {
    if (inst->opcode_ != OpSpecConstantOp) {
LAB_0056681e:
      __assert_fail("inst->opcode() == spv::Op::OpCompositeInsert || (inst->opcode() == spv::Op::OpSpecConstantOp && spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) == spv::Op::OpCompositeInsert)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                    ,0x269,
                    "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert(Instruction *)"
                   );
    }
    uVar5 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar5 = (uint)inst->has_result_id_;
    }
    uVar5 = Instruction::GetSingleWordOperand(inst,uVar5);
    if (uVar5 != 0x52) goto LAB_0056681e;
    bVar12 = inst->opcode_ == OpSpecConstantOp;
    iVar6 = bVar12 + 1;
    uVar10 = bVar12 | 2;
  }
  uVar9 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar9 = (uint)inst->has_result_id_;
  }
  uVar5 = Instruction::GetSingleWordOperand(inst,uVar9 + iVar6);
  pIVar3 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar3->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar3);
  }
  pIVar8 = analysis::DefUseManager::GetDef
                     ((pIVar3->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar5);
  index = 0;
  uVar5 = 0;
  if (pIVar8->has_type_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar8,0);
  }
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    __args = Instruction::GetInOperand(inst,index);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spvtools::opt::Operand&>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               __args);
    index = index + 1;
  } while (uVar10 != index);
  uVar9 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar9 = (uint)inst->has_result_id_;
  }
  if (uVar10 < (int)((ulong)((long)(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
               uVar9) {
    bVar12 = false;
    do {
      bVar11 = bVar12;
      member_idx = (_Type)Instruction::GetSingleWordOperand(inst,uVar9 + uVar10);
      aVar7._M_elems = (_Type)GetNewMemberIndex(this,uVar5,(uint32_t)member_idx);
      if (aVar7._M_elems == (_Type)0xffffffff) {
        IRContext::KillInst((this->super_MemPass).super_Pass.context_,inst);
        bVar12 = true;
        goto LAB_00566800;
      }
      local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
      local_a0._24_8_ = local_a0 + 0x10;
      local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a0._8_8_ = 1;
      local_78._0_4_ = SPV_OPERAND_TYPE_LITERAL_INTEGER;
      local_78._8_8_ = &PTR__SmallVector_00b02ef8;
      local_78._16_8_ = 0;
      local_78._32_8_ = local_78 + 0x18;
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a0._16_4_ = aVar7._M_elems;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_78 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_a0);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_78);
      local_78._8_8_ = &PTR__SmallVector_00b02ef8;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_50,local_50._M_head_impl);
      }
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_80,local_80._M_head_impl);
      }
      pIVar3 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar3->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar3);
      }
      pIVar8 = analysis::DefUseManager::GetDef
                         ((pIVar3->def_use_mgr_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                          _M_head_impl,uVar5);
      OVar2 = pIVar8->opcode_;
      if ((int)OVar2 < 0x1168) {
        if (OpTypeStruct < OVar2) {
LAB_0056683d:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                        ,0x299,
                        "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert(Instruction *)"
                       );
        }
        if ((0x31800000U >> (OVar2 & OpTypeOpaque) & 1) != 0) goto LAB_005666e0;
        if (OVar2 != OpTypeStruct) goto LAB_0056683d;
        uVar9 = (pIVar8->has_result_id_ & 1) + 1;
        if (pIVar8->has_type_id_ == false) {
          uVar9 = (uint)pIVar8->has_result_id_;
        }
        uVar5 = uVar9 + (int)aVar7._M_elems;
      }
      else {
        if (((OVar2 != OpTypeCooperativeMatrixKHR) && (OVar2 != OpTypeCooperativeVectorNV)) &&
           (OVar2 != OpTypeCooperativeMatrixNV)) goto LAB_0056683d;
LAB_005666e0:
        uVar5 = (pIVar8->has_result_id_ & 1) + 1;
        if (pIVar8->has_type_id_ == false) {
          uVar5 = (uint)pIVar8->has_result_id_;
        }
      }
      uVar5 = Instruction::GetSingleWordOperand(pIVar8,uVar5);
      uVar10 = uVar10 + 1;
      __last._M_current =
           (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      pOVar4 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar1 = inst->has_result_id_;
      uVar9 = (bVar1 & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar9 = (uint)bVar1;
      }
      bVar12 = (bool)(bVar11 | member_idx != aVar7._M_elems);
    } while (uVar10 < (int)((ulong)((long)__last._M_current - (long)pOVar4) >> 4) * -0x55555555 -
                      uVar9);
    if (bVar11 || member_idx != aVar7._M_elems) {
      uVar10 = (bVar1 & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar10 = (uint)bVar1;
      }
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                (&inst->operands_,
                 (Operand *)
                 ((long)((pOVar4->words).buffer + 0xfffffffffffffffa) + (ulong)(uVar10 * 0x30)),
                 __last);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &inst->operands_,
                 (inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_48.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_48.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pIVar3 = (this->super_MemPass).super_Pass.context_;
      bVar12 = true;
      if ((pIVar3->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::UpdateDefUse
                  ((pIVar3->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,inst);
      }
      goto LAB_00566800;
    }
  }
  bVar12 = false;
LAB_00566800:
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  return bVar12;
}

Assistant:

bool EliminateDeadMembersPass::UpdateCompositeInsert(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeInsert ||
         (inst->opcode() == spv::Op::OpSpecConstantOp &&
          spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) ==
              spv::Op::OpCompositeInsert));

  uint32_t first_operand = 0;
  if (inst->opcode() == spv::Op::OpSpecConstantOp) {
    first_operand = 1;
  }

  uint32_t composite_id = inst->GetSingleWordInOperand(first_operand + 1);
  Instruction* composite_inst = get_def_use_mgr()->GetDef(composite_id);
  uint32_t type_id = composite_inst->type_id();

  Instruction::OperandList new_operands;
  bool modified = false;

  for (uint32_t i = 0; i < first_operand + 2; ++i) {
    new_operands.emplace_back(inst->GetInOperand(i));
  }
  for (uint32_t i = first_operand + 2; i < inst->NumInOperands(); ++i) {
    uint32_t member_idx = inst->GetSingleWordInOperand(i);
    uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);
    if (new_member_idx == kRemovedMember) {
      context()->KillInst(inst);
      return true;
    }

    if (member_idx != new_member_idx) {
      modified = true;
    }
    new_operands.emplace_back(
        Operand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {new_member_idx}}));

    Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeStruct:
        // The type will have already been rewritten, so use the new member
        // index.
        type_id = type_inst->GetSingleWordInOperand(new_member_idx);
        break;
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeVectorNV:
        type_id = type_inst->GetSingleWordInOperand(0);
        break;
      default:
        assert(false);
    }
  }

  if (!modified) {
    return false;
  }
  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}